

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O1

void __thiscall QuadList<SSTableDataEntry>::~QuadList(QuadList<SSTableDataEntry> *this)

{
  ~QuadList(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

QuadList<T>::~QuadList() {
    if (!empty())
        clear();
    delete header;
    delete trailer;
}